

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

ArrayBuilder<capnp::_::RawSchema_*> * __thiscall
kj::ArrayBuilder<capnp::_::RawSchema_*>::operator=
          (ArrayBuilder<capnp::_::RawSchema_*> *this,ArrayBuilder<capnp::_::RawSchema_*> *other)

{
  RawSchema **ppRVar1;
  RemoveConst<capnp::_::RawSchema_*> *ppRVar2;
  RawSchema **ppRVar3;
  ArrayDisposer *pAVar4;
  
  ppRVar1 = this->ptr;
  if (ppRVar1 != (RawSchema **)0x0) {
    ppRVar2 = this->pos;
    ppRVar3 = this->endPtr;
    this->ptr = (RawSchema **)0x0;
    this->pos = (RemoveConst<capnp::_::RawSchema_*> *)0x0;
    this->endPtr = (RawSchema **)0x0;
    (**this->disposer->_vptr_ArrayDisposer)
              (this->disposer,ppRVar1,8,(long)ppRVar2 - (long)ppRVar1 >> 3,
               (long)ppRVar3 - (long)ppRVar1 >> 3,0);
  }
  ppRVar2 = other->pos;
  this->ptr = other->ptr;
  this->pos = ppRVar2;
  pAVar4 = other->disposer;
  this->endPtr = other->endPtr;
  this->disposer = pAVar4;
  other->ptr = (RawSchema **)0x0;
  other->pos = (RemoveConst<capnp::_::RawSchema_*> *)0x0;
  other->endPtr = (RawSchema **)0x0;
  return this;
}

Assistant:

ArrayBuilder& operator=(ArrayBuilder&& other) {
    dispose();
    ptr = other.ptr;
    pos = other.pos;
    endPtr = other.endPtr;
    disposer = other.disposer;
    other.ptr = nullptr;
    other.pos = nullptr;
    other.endPtr = nullptr;
    return *this;
  }